

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O2

int __thiscall
TPZSparseBlockDiagonal<long_double>::Substitution
          (TPZSparseBlockDiagonal<long_double> *this,TPZFMatrix<long_double> *B)

{
  int iVar1;
  TPZFNMatrix<1000,_long_double> BG;
  TPZFNMatrix<1000,_long_double> TStack_3f48;
  
  TPZFNMatrix<1000,_long_double>::TPZFNMatrix
            (&TStack_3f48,(this->fBlock).fNElements,
             (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
  Gather(this,B,&TStack_3f48.super_TPZFMatrix<long_double>);
  iVar1 = TPZBlockDiagonal<long_double>::Substitution
                    (&this->super_TPZBlockDiagonal<long_double>,
                     &TStack_3f48.super_TPZFMatrix<long_double>);
  (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(B)
  ;
  Scatter(this,&TStack_3f48.super_TPZFMatrix<long_double>,B);
  TPZFNMatrix<1000,_long_double>::~TPZFNMatrix(&TStack_3f48);
  return iVar1;
}

Assistant:

int TPZSparseBlockDiagonal<TVar>::Substitution(TPZFMatrix<TVar>* B) const
{
	TPZFNMatrix<1000,TVar > BG(fBlock.NElements(),B->Cols());
	Gather(*B,BG);
	int result = TPZBlockDiagonal<TVar>::Substitution(&BG);
	B->Zero();
	Scatter(BG,*B);
	return result;
	
}